

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O3

void fe::operations::
     applyOperationT<fe::operations::op_blit_colored,fe::PixelB8G8R8A8,fe::PixelB8G8R8A8>
               (op_blit_colored *op,PixelB8G8R8A8 *srcPixelFormat,PixelB8G8R8A8 *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  int iVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  bVar7 = check(src,dest);
  auVar6 = _DAT_00116220;
  if ((bVar7) && (iVar1 = (dest->super_fe_image).h, iVar1 != 0)) {
    iVar2 = (dest->super_fe_image).w;
    puVar11 = (dest->super_fe_image).data;
    puVar12 = (src->super_fe_image).data;
    iVar10 = 0;
    iVar5 = iVar2;
    puVar9 = puVar12;
    puVar8 = puVar11;
    do {
      for (; iVar5 != 0; iVar5 = iVar5 + -1) {
        uVar3 = *(undefined4 *)puVar12;
        uVar4 = *(undefined4 *)(op->color).field_0.field_0.bytes;
        auVar15._8_8_ = 0;
        auVar15._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar4 >> 0x10),uVar4)) >>
                                                  0x20),uVar4) >> 0x18),
                                             CONCAT12((char)((uint)uVar4 >> 8),(short)uVar4)) >>
                                   0x10),(short)uVar4) & 0xffff00ff00ff00ff;
        auVar15 = pshuflw(auVar15,auVar15,0xc6);
        auVar16._0_2_ = auVar15._0_2_ * ((ushort)uVar3 & 0xff);
        auVar16._2_2_ = auVar15._2_2_ * (ushort)(byte)((uint)uVar3 >> 8);
        auVar16._4_2_ = auVar15._4_2_ * (ushort)(byte)((uint)uVar3 >> 0x10);
        auVar16._6_2_ = auVar15._6_2_ * (ushort)(byte)((uint)uVar3 >> 0x18);
        auVar16._8_8_ = 0;
        auVar15 = pmulhuw(auVar16,auVar6);
        uVar13 = auVar15._0_2_ >> 7;
        uVar17 = auVar15._2_2_ >> 7;
        uVar19 = auVar15._4_2_ >> 7;
        uVar21 = auVar15._6_2_ >> 7;
        uVar14 = uVar13 & 0xff;
        uVar18 = uVar17 & 0xff;
        uVar20 = uVar19 & 0xff;
        uVar22 = uVar21 & 0xff;
        *(uint *)puVar11 =
             CONCAT13((uVar22 != 0) * (uVar22 < 0x100) * (char)uVar21 - (0xff < uVar22),
                      CONCAT12((uVar20 != 0) * (uVar20 < 0x100) * (char)uVar19 - (0xff < uVar20),
                               CONCAT11((uVar18 != 0) * (uVar18 < 0x100) * (char)uVar17 -
                                        (0xff < uVar18),
                                        (uVar14 != 0) * (uVar14 < 0x100) * (char)uVar13 -
                                        (0xff < uVar14))));
        puVar11 = puVar11 + (dest->super_fe_image).bytespp;
        puVar12 = puVar12 + (src->super_fe_image).bytespp;
      }
      puVar12 = puVar9 + (src->super_fe_image).pitch;
      puVar11 = puVar8 + (dest->super_fe_image).pitch;
      iVar10 = iVar10 + 1;
      iVar5 = iVar2;
      puVar9 = puVar12;
      puVar8 = puVar11;
    } while (iVar10 != iVar1);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }